

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::MaxOrder(TPZCompElHDiv<pzshape::TPZShapeTriang> *this)

{
  int iVar1;
  
  iVar1 = TPZInterpolationSpace::MaxOrder((TPZInterpolationSpace *)this);
  return iVar1 + 1;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::MaxOrder(){

    int maxorder = TPZInterpolationSpace::MaxOrder();
    // if (fhdivfam == HDivFamily::EHDivConstant){
    //     if (TSHAPE::Type() == ETetraedro || TSHAPE::Type() == ETriangle){
    //         maxorder++;
    //     }
    // }
    return maxorder+1;
}